

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# int_helper.c
# Opt level: O1

void helper_vpmsumd_ppc64(ppc_avr_t *r,ppc_avr_t *a,ppc_avr_t *b)

{
  ulong uVar1;
  byte bVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  ulong auStack_30 [2];
  __uint128_t prod [2];
  
  lVar4 = 1;
  do {
    puVar6 = (ulong *)((long)prod + lVar4 * 0x10 + -8);
    *puVar6 = 0;
    *(undefined8 *)(prod + lVar4) = 0;
    uVar1 = a->u64[lVar4];
    uVar5 = 0;
    do {
      if ((uVar1 >> (uVar5 & 0x3f) & 1) != 0) {
        bVar2 = (byte)uVar5 & 0x3f;
        uVar7 = b->u64[lVar4] << ((byte)uVar5 & 0x3f);
        uVar8 = uVar7;
        uVar3 = 0L << bVar2 | b->u64[lVar4] >> 0x40 - bVar2;
        if ((uVar5 & 0x40) != 0) {
          uVar8 = 0;
          uVar3 = uVar7;
        }
        *puVar6 = *puVar6 ^ uVar8;
        *(ulong *)(prod + lVar4) = (ulong)prod[lVar4] ^ uVar3;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != 0x40);
    bVar9 = lVar4 != 0;
    lVar4 = lVar4 + -1;
  } while (bVar9);
  r->u64[0] = prod[0]._8_8_ ^ auStack_30[1];
  r->u64[1] = (ulong)prod[1] ^ (ulong)prod[0];
  return;
}

Assistant:

void helper_vpmsumd(ppc_avr_t *r, ppc_avr_t *a, ppc_avr_t *b)
{

#ifdef CONFIG_INT128
    int i, j;
    __uint128_t prod[2];

    VECTOR_FOR_INORDER_I(i, u64) {
        prod[i] = 0;
        for (j = 0; j < 64; j++) {
            if (a->u64[i] & (1ull << j)) {
                prod[i] ^= (((__uint128_t)b->u64[i]) << j);
            }
        }
    }

    r->u128 = prod[0] ^ prod[1];

#else
    int i, j;
    ppc_avr_t prod[2];

    VECTOR_FOR_INORDER_I(i, u64) {
        prod[i].VsrD(1) = prod[i].VsrD(0) = 0;
        for (j = 0; j < 64; j++) {
            if (a->u64[i] & (1ull << j)) {
                ppc_avr_t bshift;
                if (j == 0) {
                    bshift.VsrD(0) = 0;
                    bshift.VsrD(1) = b->u64[i];
                } else {
                    bshift.VsrD(0) = b->u64[i] >> (64 - j);
                    bshift.VsrD(1) = b->u64[i] << j;
                }
                prod[i].VsrD(1) ^= bshift.VsrD(1);
                prod[i].VsrD(0) ^= bshift.VsrD(0);
            }
        }
    }

    r->VsrD(1) = prod[0].VsrD(1) ^ prod[1].VsrD(1);
    r->VsrD(0) = prod[0].VsrD(0) ^ prod[1].VsrD(0);
#endif
}